

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O0

bool QMetaType::
     registerMutableView<QList<unsigned_int>,QIterable<QMetaSequence>,QtPrivate::QSequentialIterableMutableViewFunctor<QList<unsigned_int>>>
               (void)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  anon_class_1_1_3a3b9956 view;
  QMetaType toType;
  QMetaType fromType;
  anon_class_1_1_3a3b9956 *__f;
  function<bool_(void_*,_void_*)> *this;
  QMetaType in_stack_ffffffffffffffd0;
  QMetaType in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __f = (anon_class_1_1_3a3b9956 *)&DAT_aaaaaaaaaaaaaaaa;
  fromType<QList<unsigned_int>>();
  fromType<QIterable<QMetaSequence>>();
  this = (function<bool_(void_*,_void_*)> *)&stack0xffffffffffffffc0;
  std::function<bool(void*,void*)>::
  function<QMetaType::registerMutableView<QList<unsigned_int>,QIterable<QMetaSequence>,QtPrivate::QSequentialIterableMutableViewFunctor<QList<unsigned_int>>>(QtPrivate::QSequentialIterableMutableViewFunctor<QList<unsigned_int>>)::_lambda(void*,void*)_1_,void>
            (this,__f);
  bVar2 = registerMutableViewImpl<QList<unsigned_int>,QIterable<QMetaSequence>>
                    (this,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  std::function<bool_(void_*,_void_*)>::~function((function<bool_(void_*,_void_*)> *)0x3e6358);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

static bool registerMutableView(UnaryFunction function)
    {
        static_assert((!QMetaTypeId2<To>::IsBuiltIn || !QMetaTypeId2<From>::IsBuiltIn),
            "QMetaType::registerMutableView: At least one of the types must be a custom type.");

        const QMetaType fromType = QMetaType::fromType<From>();
        const QMetaType toType = QMetaType::fromType<To>();
        auto view = [function = std::move(function)](void *from, void *to) -> bool {
            From *f = static_cast<From *>(from);
            To *t = static_cast<To *>(to);
            *t = function(*f);
            return true;
        };
        return registerMutableViewImpl<From, To>(std::move(view), fromType, toType);
    }